

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_comp_mask_pred_c
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  int local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  int stride1;
  int stride0;
  uint8_t *src1;
  uint8_t *src0;
  int j;
  int i;
  int ref_stride_local;
  uint8_t *ref_local;
  int height_local;
  int width_local;
  uint8_t *pred_local;
  uint8_t *comp_pred_local;
  
  local_50 = ref;
  if (invert_mask != 0) {
    local_50 = pred;
  }
  src0 = local_50;
  local_58 = pred;
  if (invert_mask != 0) {
    local_58 = ref;
  }
  src1 = local_58;
  local_60 = width;
  if (invert_mask != 0) {
    local_60 = ref_stride;
    ref_stride = width;
  }
  comp_pred_local = comp_pred;
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      comp_pred_local[j] =
           (uint8_t)((int)((uint)mask[j] * (uint)src0[j] + (0x40 - (uint)mask[j]) * (uint)src1[j] +
                          0x20) >> 6);
    }
    comp_pred_local = comp_pred_local + width;
    src0 = src0 + ref_stride;
    src1 = src1 + local_60;
    mask = mask + mask_stride;
  }
  return;
}

Assistant:

void aom_comp_mask_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                          int height, const uint8_t *ref, int ref_stride,
                          const uint8_t *mask, int mask_stride,
                          int invert_mask) {
  int i, j;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = AOM_BLEND_A64(mask[j], src0[j], src1[j]);
    }
    comp_pred += width;
    src0 += stride0;
    src1 += stride1;
    mask += mask_stride;
  }
}